

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_estimateCCtxSize(int compressionLevel)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  size_t largestSize;
  int compressionLevel_00;
  ulong uVar4;
  bool bVar5;
  undefined1 in_stack_00000090 [28];
  ZSTD_compressionParameters local_50;
  
  compressionLevel_00 = 1;
  if (compressionLevel < 1) {
    compressionLevel_00 = compressionLevel;
  }
  uVar4 = 0;
  do {
    lVar3 = 0;
    sVar2 = 0;
    do {
      ZSTD_getCParams_internal
                (&local_50,compressionLevel_00,
                 *(unsigned_long_long *)((long)&ZSTD_estimateCCtxSize_internal_srcSizeTiers + lVar3)
                 ,0,ZSTD_cpm_noAttachDict);
      sVar1 = ZSTD_estimateCCtxSize_usingCParams((ZSTD_compressionParameters)in_stack_00000090);
      if (sVar2 < sVar1) {
        sVar2 = ZSTD_estimateCCtxSize_usingCParams((ZSTD_compressionParameters)in_stack_00000090);
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    if (uVar4 < sVar2) {
      uVar4 = sVar2;
    }
    bVar5 = compressionLevel_00 != compressionLevel;
    compressionLevel_00 = compressionLevel_00 + 1;
  } while (bVar5);
  return uVar4;
}

Assistant:

size_t ZSTD_estimateCCtxSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=MIN(compressionLevel, 1); level<=compressionLevel; level++) {
        /* Ensure monotonically increasing memory usage as compression level increases */
        size_t const newMB = ZSTD_estimateCCtxSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}